

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

void Abc_SopToTruthBig(char *pSop,int nInputs,word **pVars,word *pCube,word *pRes)

{
  int iVar1;
  int local_48;
  int local_44;
  int local_40;
  int lit;
  int i;
  int v;
  int nWords;
  int nVars;
  word *pRes_local;
  word *pCube_local;
  word **pVars_local;
  int nInputs_local;
  char *pSop_local;
  
  iVar1 = Abc_SopGetVarNum(pSop);
  if (iVar1 < 7) {
    local_48 = 1;
  }
  else {
    local_48 = 1 << ((char)iVar1 - 6U & 0x1f);
  }
  local_44 = 0;
  if ((iVar1 < 0) || (0x10 < iVar1)) {
    __assert_fail("nVars >= 0 && nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                  ,0x4ff,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
  }
  if (iVar1 != nInputs) {
    __assert_fail("nVars == nInputs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                  ,0x500,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
  }
  for (local_40 = 0; local_40 < local_48; local_40 = local_40 + 1) {
    pRes[local_40] = 0;
  }
  do {
    for (local_40 = 0; local_40 < local_48; local_40 = local_40 + 1) {
      pCube[local_40] = 0xffffffffffffffff;
    }
    for (lit = 0; lit < iVar1; lit = lit + 1) {
      if (pSop[local_44] == '1') {
        for (local_40 = 0; local_40 < local_48; local_40 = local_40 + 1) {
          pCube[local_40] = pVars[lit][local_40] & pCube[local_40];
        }
      }
      else if (pSop[local_44] == '0') {
        for (local_40 = 0; local_40 < local_48; local_40 = local_40 + 1) {
          pCube[local_40] = (pVars[lit][local_40] ^ 0xffffffffffffffff) & pCube[local_40];
        }
      }
      else if (pSop[local_44] != '-') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                      ,0x513,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
      }
      local_44 = local_44 + 1;
    }
    for (local_40 = 0; local_40 < local_48; local_40 = local_40 + 1) {
      pRes[local_40] = pCube[local_40] | pRes[local_40];
    }
    if (pSop[local_44] != ' ') {
      __assert_fail("pSop[lit] == \' \'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                    ,0x517,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
    }
    if (pSop[local_44 + 2] != '\n') {
      __assert_fail("pSop[lit] == \'\\n\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                    ,0x51a,"void Abc_SopToTruthBig(char *, int, word **, word *, word *)");
    }
    local_44 = local_44 + 3;
  } while (pSop[local_44] != '\0');
  iVar1 = Abc_SopIsComplement(pSop);
  if (iVar1 != 0) {
    for (local_40 = 0; local_40 < local_48; local_40 = local_40 + 1) {
      pRes[local_40] = pRes[local_40] ^ 0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

void Abc_SopToTruthBig( char * pSop, int nInputs, word ** pVars, word * pCube, word * pRes )
{
    int nVars = Abc_SopGetVarNum(pSop);
    int nWords = nVars <= 6 ? 1 : 1 << (nVars-6);
    int v, i, lit = 0;
    assert( nVars >= 0 && nVars <= 16 );
    assert( nVars == nInputs );
    for ( i = 0; i < nWords; i++ )
        pRes[i] = 0;
    do {
        for ( i = 0; i < nWords; i++ )
            pCube[i] = ~(word)0;
        for ( v = 0; v < nVars; v++, lit++ )
        {
            if ( pSop[lit] == '1' )
            {
                for ( i = 0; i < nWords; i++ )
                    pCube[i] &= pVars[v][i];
            }
            else if ( pSop[lit] == '0' )
            {
                for ( i = 0; i < nWords; i++ )
                    pCube[i] &= ~pVars[v][i];
            }
            else if ( pSop[lit] != '-' )
                assert( 0 );
        }
        for ( i = 0; i < nWords; i++ )
            pRes[i] |= pCube[i];
        assert( pSop[lit] == ' ' );
        lit++;
        lit++;
        assert( pSop[lit] == '\n' );
        lit++;
    } while ( pSop[lit] );
    if ( Abc_SopIsComplement(pSop) )
    {
        for ( i = 0; i < nWords; i++ )
            pRes[i] = ~pRes[i];
    }
}